

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O2

IAnimatedMesh * __thiscall irr::scene::CSceneManager::getMesh(CSceneManager *this,IReadFile *file)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  IAnimatedMesh *pIVar2;
  path name;
  string<char> sStack_38;
  
  if (file == (IReadFile *)0x0) {
    pIVar2 = (IAnimatedMesh *)0x0;
  }
  else {
    iVar1 = (*file->_vptr_IReadFile[4])(file);
    core::string<char>::string(&sStack_38,(string<char> *)CONCAT44(extraout_var,iVar1));
    iVar1 = (*this->MeshCache->_vptr_IMeshCache[7])(this->MeshCache,&sStack_38);
    pIVar2 = (IAnimatedMesh *)CONCAT44(extraout_var_00,iVar1);
    if (pIVar2 == (IAnimatedMesh *)0x0) {
      pIVar2 = getUncachedMesh(this,file,&sStack_38,&sStack_38);
    }
    ::std::__cxx11::string::_M_dispose();
  }
  return pIVar2;
}

Assistant:

IAnimatedMesh *CSceneManager::getMesh(io::IReadFile *file)
{
	if (!file)
		return 0;

	io::path name = file->getFileName();
	IAnimatedMesh *msh = MeshCache->getMeshByName(name);
	if (msh)
		return msh;

	msh = getUncachedMesh(file, name, name);

	return msh;
}